

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * GetEnumName_abi_cxx11_(string *__return_storage_ptr__,JSONErrorType err)

{
  string *psVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = (string *)(*(code *)(&DAT_00135010 + *(int *)(&DAT_00135010 + (ulong)err * 4)))();
  return psVar1;
}

Assistant:

string GetEnumName(JSONErrorType err)
{
    switch (err)
    {
        case JSONErrorType::NAME_ALREADY_EXITS: return "NAME_ALREADY_EXITS";
        case JSONErrorType::NAME_NOT_FOUND: return "NAME_NOT_FOUND";
        case JSONErrorType::INVALID_JSON_OBJECT: return "INVALID_JSON_OBJECT";
        case JSONErrorType::INVALID_ARRAY: return "INVALID_ARRAY";
        case JSONErrorType::INVALID_TYPE: return "INVALID_TYPE";
        case JSONErrorType::INVALID_CAST: return "INVALID_CAST";
        case JSONErrorType::EXPECTED_BOOL: return "EXPECTED_BOOL";
        case JSONErrorType::EXPECTED_NULL: return "EXPECTED_NULL";
        case JSONErrorType::EXPECTED_NUM: return "EXPECTED_NUM";
        case JSONErrorType::WRONG_PLACED_SEPERATOR: return "WRONG_PLACED_SEPERATOR";
        case JSONErrorType::MISSING_KEY: return "MISSING_KEY";
        case JSONErrorType::MISSING_VALUE: return "MISSING_VALUE";
        case JSONErrorType::MISSING_SEPERATOR: return "MISSING_SEPERATOR";
    }
}